

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O3

void __thiscall
google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::swap
          (Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *this,
          Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *other)

{
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> copy;
  InnerMap local_40;
  
  if ((this->elements_).alloc_.arena_ != (other->elements_).alloc_.arena_) {
    Map((Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *)&local_40,this);
    operator=(this,other);
    operator=(other,(Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *)&local_40);
    InnerMap::~InnerMap(&local_40);
    return;
  }
  InnerMap::Swap(&this->elements_,&other->elements_);
  return;
}

Assistant:

void swap(Map& other) {
    if (arena() == other.arena()) {
      InternalSwap(other);
    } else {
      // TODO(zuguang): optimize this. The temporary copy can be allocated
      // in the same arena as the other message, and the "other = copy" can
      // be replaced with the fast-path swap above.
      Map copy = *this;
      *this = other;
      other = copy;
    }
  }